

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O2

void __thiscall proto2_unittest::TestEagerMessage::~TestEagerMessage(TestEagerMessage *this)

{
  SharedDtor((MessageLite *)this);
  return;
}

Assistant:

TestEagerMessage::~TestEagerMessage() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestEagerMessage)
  SharedDtor(*this);
}